

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t Catch::listReporters(void)

{
  int iVar1;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar2;
  undefined4 extraout_var;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  Column *this;
  Column *other;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Column local_c8;
  Column local_98;
  Columns local_68;
  string local_50;
  
  std::operator<<((ostream *)&std::cout,"Available reporters:\n");
  pSVar2 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar1 = (*(pSVar2->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar2);
  lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))
                    ((long *)CONCAT44(extraout_var,iVar1));
  p_Var7 = (_Base_ptr)0x0;
  p_Var6 = *(_Rb_tree_node_base **)(lVar3 + 0x18);
  for (p_Var4 = p_Var6; p_Var4 != (_Rb_tree_node_base *)(lVar3 + 8);
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    if (p_Var7 <= p_Var4[1]._M_parent) {
      p_Var7 = p_Var4[1]._M_parent;
    }
  }
  for (; p_Var6 != (_Rb_tree_node_base *)(lVar3 + 8);
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    std::operator+(&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 1)
                   ,":");
    clara::TextFlow::Column::Column(&local_98,(string *)&local_e8);
    local_98.m_indent = 2;
    this = clara::TextFlow::Column::width(&local_98,(size_t)&p_Var7->field_0x5);
    (**(code **)(**(long **)(p_Var6 + 2) + 0x18))(&local_50);
    clara::TextFlow::Column::Column(&local_c8,&local_50);
    local_c8.m_initialIndent = 0;
    local_c8.m_indent = 2;
    other = clara::TextFlow::Column::width(&local_c8,0x48 - (long)p_Var7);
    clara::TextFlow::Column::operator+(&local_68,this,other);
    poVar5 = clara::TextFlow::operator<<((ostream *)&std::cout,&local_68);
    std::operator<<(poVar5,"\n");
    clara::std::
    vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::~vector
              (&local_68.m_columns);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_c8);
    std::__cxx11::string::~string((string *)&local_50);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_98);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return *(size_t *)(lVar3 + 0x28);
}

Assistant:

std::size_t listReporters() {
        Catch::cout() << "Available reporters:\n";
        IReporterRegistry::FactoryMap const& factories = getRegistryHub().getReporterRegistry().getFactories();
        std::size_t maxNameLen = 0;
        for( auto const& factoryKvp : factories )
            maxNameLen = (std::max)( maxNameLen, factoryKvp.first.size() );

        for( auto const& factoryKvp : factories ) {
            Catch::cout()
                    << Column( factoryKvp.first + ":" )
                            .indent(2)
                            .width( 5+maxNameLen )
                    +  Column( factoryKvp.second->getDescription() )
                            .initialIndent(0)
                            .indent(2)
                            .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen-8 )
                    << "\n";
        }
        Catch::cout() << std::endl;
        return factories.size();
    }